

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O1

void __thiscall
Transaction_GetRwInt_Test::~Transaction_GetRwInt_Test(Transaction_GetRwInt_Test *this)

{
  (this->super_Transaction).super_Test._vptr_Test = (_func_int **)&PTR__Transaction_00277410;
  (this->super_Transaction).db_.super_database._vptr_database =
       (_func_int **)&PTR__mock_database_00277450;
  testing::internal::FunctionMocker<pstore::address_(unsigned_long,_unsigned_int)>::~FunctionMocker
            (&(this->super_Transaction).db_.gmock02_allocate_52);
  testing::internal::
  FunctionMocker<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
  ~FunctionMocker(&(this->super_Transaction).db_.gmock14_get_51);
  pstore::database::~database(&(this->super_Transaction).db_.super_database);
  in_memory_store::~in_memory_store(&(this->super_Transaction).store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x1e0);
  return;
}

Assistant:

TEST_F (Transaction, GetRwInt) {
    // First setup the mock expectations.
    {
        using ::testing::Expectation;
        using ::testing::Ge;
        using ::testing::Invoke;

        Expectation allocate_int = EXPECT_CALL (db_, allocate (sizeof (int), alignof (int)))
                                       .WillOnce (Invoke (&db_, &mock_database::base_allocate));

        // A call to get(). First argument (address) must lie beyond the initial transaction
        // and must request a writable int.
        EXPECT_CALL (db_, get (Ge (pstore::address{pstore::leader_size + sizeof (pstore::trailer)}),
                               sizeof (int), false, true))
            .After (allocate_int)
            .WillOnce (Invoke (&db_, &mock_database::base_get));
    }
    // Now the real body of the test
    {
        mock_mutex mutex;
        auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});
        transaction.alloc_rw<int> ();
        transaction.commit ();
    }
}